

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall ctemplate::BaseArena::set_handle_alignment(BaseArena *this,int align)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  
  if ((align < 1) || ((align + 0x7fffffffU & align) != 0)) {
    pcVar3 = "align > 0 && 0 == (align & (align - 1))";
  }
  else if ((ulong)(uint)align < this->block_size_) {
    if (this->block_size_ % (ulong)(uint)align == 0) {
      bVar1 = is_empty(this);
      if (bVar1) {
        this->handle_alignment_ = align;
        iVar2 = -1;
        do {
          iVar2 = iVar2 + 1;
        } while (1 << ((byte)iVar2 & 0x1f) < align);
        this->handle_alignment_bits_ = iVar2;
        return;
      }
      pcVar3 = "is_empty()";
    }
    else {
      pcVar3 = "(block_size_ % align) == 0";
    }
  }
  else {
    pcVar3 = "static_cast<size_t>(align) < block_size_";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar3);
  exit(1);
}

Assistant:

void BaseArena::set_handle_alignment(int align) {
  CHECK(align > 0 && 0 == (align & (align - 1)));  // must be power of 2
  CHECK(static_cast<size_t>(align) < block_size_);
  CHECK((block_size_ % align) == 0);
  CHECK(is_empty());
  handle_alignment_ = align;
  handle_alignment_bits_ = 0;
  while ((1 << handle_alignment_bits_) < handle_alignment_) {
    ++handle_alignment_bits_;
  }
}